

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginDragDropTarget(void)

{
  ImGuiWindow *r_abs;
  ImGuiID id;
  ImRect *display_rect;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImRect *local_30;
  ImGuiID local_24;
  ImGuiContext *pIVar1;
  bool local_1;
  
  if ((GImGui->DragDropActive & 1U) == 0) {
    local_1 = false;
  }
  else {
    r_abs = GImGui->CurrentWindow;
    if (((r_abs->DC).LastItemStatusFlags & 1U) == 0) {
      local_1 = false;
    }
    else if ((GImGui->HoveredWindow == (ImGuiWindow *)0x0) ||
            (r_abs->RootWindow != GImGui->HoveredWindow->RootWindow)) {
      local_1 = false;
    }
    else {
      if (((r_abs->DC).LastItemStatusFlags & 2U) == 0) {
        local_30 = &(r_abs->DC).LastItemRect;
      }
      else {
        local_30 = &(r_abs->DC).LastItemDisplayRect;
      }
      local_24 = (r_abs->DC).LastItemId;
      pIVar1 = GImGui;
      if (local_24 == 0) {
        local_24 = ImGuiWindow::GetIDFromRectangle((ImGuiWindow *)GImGui,(ImRect *)r_abs);
      }
      if ((pIVar1->DragDropPayload).SourceId == local_24) {
        local_1 = false;
      }
      else {
        (pIVar1->DragDropTargetRect).Min = local_30->Min;
        (pIVar1->DragDropTargetRect).Max = local_30->Max;
        pIVar1->DragDropTargetId = local_24;
        pIVar1->DragDropWithinSourceOrTarget = true;
        local_1 = true;
      }
    }
  }
  return local_1;
}

Assistant:

bool ImGui::BeginDragDropTarget()
{
    ImGuiContext& g = *GImGui;
    if (!g.DragDropActive)
        return false;

    ImGuiWindow* window = g.CurrentWindow;
    if (!(window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HoveredRect))
        return false;
    if (g.HoveredWindow == NULL || window->RootWindow != g.HoveredWindow->RootWindow)
        return false;

    const ImRect& display_rect = (window->DC.LastItemStatusFlags & ImGuiItemStatusFlags_HasDisplayRect) ? window->DC.LastItemDisplayRect : window->DC.LastItemRect;
    ImGuiID id = window->DC.LastItemId;
    if (id == 0)
        id = window->GetIDFromRectangle(display_rect);
    if (g.DragDropPayload.SourceId == id)
        return false;

    IM_ASSERT(g.DragDropWithinSourceOrTarget == false);
    g.DragDropTargetRect = display_rect;
    g.DragDropTargetId = id;
    g.DragDropWithinSourceOrTarget = true;
    return true;
}